

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O1

void __thiscall Fl_Text_Display::offset_line_starts(Fl_Text_Display *this,int newTopLineNum)

{
  int iVar1;
  int oldFirstChar;
  int *piVar2;
  int iVar3;
  int nLines;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint endLine;
  long lVar8;
  
  iVar1 = this->mTopLineNum;
  uVar7 = newTopLineNum - iVar1;
  if (uVar7 == 0) {
    return;
  }
  oldFirstChar = this->mFirstChar;
  endLine = this->mNVisibleLines;
  lVar8 = (long)(int)endLine;
  piVar2 = this->mLineStarts;
  uVar5 = -uVar7;
  if (newTopLineNum < (int)uVar5 && newTopLineNum < iVar1) {
    nLines = newTopLineNum + -1;
    iVar3 = 0;
LAB_001d4fa7:
    iVar3 = skip_lines(this,iVar3,nLines,true);
  }
  else {
    uVar6 = uVar5;
    iVar3 = oldFirstChar;
    if (iVar1 <= newTopLineNum) {
      iVar3 = endLine + iVar1 + -1;
      nLines = newTopLineNum - iVar3;
      if (newTopLineNum < iVar3) {
        iVar3 = piVar2[(int)uVar7];
        goto LAB_001d4fde;
      }
      iVar3 = this->mNBufferLines - newTopLineNum;
      if (nLines < iVar3) {
        iVar3 = piVar2[lVar8 + -1];
        goto LAB_001d4fa7;
      }
      uVar6 = iVar3 + 1;
      iVar3 = this->mBuffer->mLength;
    }
    iVar3 = rewind_lines(this,iVar3,uVar6);
  }
LAB_001d4fde:
  this->mFirstChar = iVar3;
  if ((endLine == uVar5 || SBORROW4(endLine,uVar5) != (int)(endLine + uVar7) < 0) || -1 < (int)uVar7
     ) {
    if ((int)uVar7 < (int)endLine && 0 < (int)uVar7) {
      uVar6 = endLine - uVar7;
      if (uVar6 != 0 && (int)uVar7 <= (int)endLine) {
        uVar4 = 0;
        do {
          piVar2[uVar4] = piVar2[uVar7 + uVar4];
          uVar4 = uVar4 + 1;
        } while (uVar6 != uVar4);
      }
      endLine = endLine - 1;
    }
    else {
      uVar6 = 0;
    }
  }
  else {
    do {
      piVar2[lVar8 + -1] = piVar2[((long)newTopLineNum + lVar8 + -1) - (long)iVar1];
      lVar8 = lVar8 + -1;
    } while ((long)(ulong)uVar5 < lVar8);
    uVar6 = 0;
    endLine = uVar5;
  }
  calc_line_starts(this,uVar6,endLine);
  calc_last_char(this);
  this->mTopLineNum = newTopLineNum;
  absolute_top_line_number(this,oldFirstChar);
  return;
}

Assistant:

void Fl_Text_Display::offset_line_starts( int newTopLineNum ) {
  int oldTopLineNum = mTopLineNum;
  int oldFirstChar = mFirstChar;
  int lineDelta = newTopLineNum - oldTopLineNum;
  int nVisLines = mNVisibleLines;
  int *lineStarts = mLineStarts;
  int i, lastLineNum;
  Fl_Text_Buffer *buf = mBuffer;

  /* If there was no offset, nothing needs to be changed */
  if ( lineDelta == 0 )
    return;

  /* Find the new value for mFirstChar by counting lines from the nearest
   known line start (start or end of buffer, or the closest value in the
   lineStarts array) */
  lastLineNum = oldTopLineNum + nVisLines - 1;
  if ( newTopLineNum < oldTopLineNum && newTopLineNum < -lineDelta ) {
    mFirstChar = skip_lines( 0, newTopLineNum - 1, true );
  } else if ( newTopLineNum < oldTopLineNum ) {
    mFirstChar = rewind_lines( mFirstChar, -lineDelta );
  } else if ( newTopLineNum < lastLineNum ) {
    mFirstChar = lineStarts[ newTopLineNum - oldTopLineNum ];
  } else if ( newTopLineNum - lastLineNum < mNBufferLines - newTopLineNum ) {
    mFirstChar = skip_lines( lineStarts[ nVisLines - 1 ],
                            newTopLineNum - lastLineNum, true );
  } else {
    mFirstChar = rewind_lines( buf->length(), mNBufferLines - newTopLineNum + 1 );
  }

  /* Fill in the line starts array */
  if ( lineDelta < 0 && -lineDelta < nVisLines ) {
    for ( i = nVisLines - 1; i >= -lineDelta; i-- )
      lineStarts[ i ] = lineStarts[ i + lineDelta ];
    calc_line_starts( 0, -lineDelta );
  } else if ( lineDelta > 0 && lineDelta < nVisLines ) {
    for ( i = 0; i < nVisLines - lineDelta; i++ )
      lineStarts[ i ] = lineStarts[ i + lineDelta ];
    calc_line_starts( nVisLines - lineDelta, nVisLines - 1 );
  } else
    calc_line_starts( 0, nVisLines );

  /* Set lastChar and mTopLineNum */
  calc_last_char();
  mTopLineNum = newTopLineNum;

  /* If we're numbering lines or being asked to maintain an absolute line
   number, re-calculate the absolute line number */
  absolute_top_line_number(oldFirstChar);
}